

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall fmt::Buffer<char>::append<char>(Buffer<char> *this,char *begin,char *end)

{
  ulong uVar1;
  ptrdiff_t _Num;
  
  if (begin <= end) {
    uVar1 = this->size_ + ((long)end - (long)begin);
    if (this->capacity_ < uVar1) {
      (**this->_vptr_Buffer)(this,uVar1);
    }
    if (end != begin) {
      memmove(this->ptr_ + this->size_,begin,(long)end - (long)begin);
    }
    this->size_ = uVar1;
    return;
  }
  __assert_fail("(end >= begin) && \"negative value\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/octobanana[P]pine/src/format.h"
                ,0x326,"void fmt::Buffer<char>::append(const U *, const U *) [T = char, U = char]");
}

Assistant:

void Buffer<T>::append(const U *begin, const U *end) {
  FMT_ASSERT(end >= begin, "negative value");
  std::size_t new_size = size_ + static_cast<std::size_t>(end - begin);
  if (new_size > capacity_)
    grow(new_size);
  std::uninitialized_copy(begin, end,
                          internal::make_ptr(ptr_, capacity_) + size_);
  size_ = new_size;
}